

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueTest.hpp
# Opt level: O1

void Qentem::Test::TestGroupValue(QTest *test)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  SizeT *pSVar9;
  char *pcVar10;
  QTest *pQVar11;
  bool bVar12;
  Value<char> *pVVar13;
  StringStream<char> *pSVar14;
  ValueC value2;
  ValueC value;
  StringStream<char> ss;
  anon_union_16_5_5c8fea6c_for_Value<char>_1 local_b8;
  char local_a8;
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
  local_98;
  anon_union_16_5_5c8fea6c_for_Value<char>_1 local_88;
  char local_78;
  anon_union_16_5_5c8fea6c_for_Value<char>_1 local_68;
  undefined1 local_58;
  StringStream<char> local_48;
  QTest *local_38;
  
  local_48.storage_ = (char *)0x0;
  local_48.length_ = 0;
  local_48.capacity_ = 0;
  local_88.array_.storage_ = (Value<char> *)0x0;
  local_88._8_8_ = 0;
  local_78 = 0;
  local_b8.array_.storage_ = (Value<char> *)0x0;
  local_b8._8_8_ = 0;
  Value<char>::reset((Value<char> *)&local_88.array_);
  local_78 = '\x03';
  local_68.array_.storage_ = local_b8.array_.storage_;
  local_68._8_8_ = local_b8._8_8_;
  local_b8.array_.storage_ = (Value<char> *)0x0;
  local_b8._8_8_ = 0;
  local_58 = 2;
  Array<Qentem::Value<char>_>::operator+=(&local_88.array_,(Value<char> *)&local_68.array_);
  Value<char>::~Value((Value<char> *)&local_68.array_);
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  ~HashTable((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              *)&local_b8.array_);
  local_b8.array_.storage_ = (Value<char> *)0x0;
  local_b8._8_8_ = 0;
  if (local_78 == '\x03') {
LAB_0012ab32:
    local_68.array_.storage_ = local_b8.array_.storage_;
    local_68._8_8_ = local_b8._8_8_;
    local_b8.array_.storage_ = (Value<char> *)0x0;
    local_b8._8_8_ = 0;
    local_58 = 2;
    Array<Qentem::Value<char>_>::operator+=(&local_88.array_,(Value<char> *)&local_68.array_);
    Value<char>::~Value((Value<char> *)&local_68.array_);
  }
  else {
    if (local_78 != '\x02') {
      Value<char>::reset((Value<char> *)&local_88.array_);
      local_78 = '\x03';
      goto LAB_0012ab32;
    }
    HArray<Qentem::String<char>,_Qentem::Value<char>_>::operator+=
              ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_88.array_,
               (HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_b8.array_);
  }
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  ~HashTable((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              *)&local_b8.array_);
  local_b8.array_.storage_ = (Value<char> *)0x0;
  local_b8._8_8_ = 0;
  if (local_78 == '\x03') {
LAB_0012aba8:
    local_68.array_.storage_ = local_b8.array_.storage_;
    local_68._8_8_ = local_b8._8_8_;
    local_b8.array_.storage_ = (Value<char> *)0x0;
    local_b8._8_8_ = 0;
    local_58 = 2;
    Array<Qentem::Value<char>_>::operator+=(&local_88.array_,(Value<char> *)&local_68.array_);
    Value<char>::~Value((Value<char> *)&local_68.array_);
  }
  else {
    if (local_78 != '\x02') {
      Value<char>::reset((Value<char> *)&local_88.array_);
      local_78 = '\x03';
      goto LAB_0012aba8;
    }
    HArray<Qentem::String<char>,_Qentem::Value<char>_>::operator+=
              ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_88.array_,
               (HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_b8.array_);
  }
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  ~HashTable((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              *)&local_b8.array_);
  local_b8.array_.storage_ = (Value<char> *)0x0;
  local_b8._8_8_ = 0;
  if (local_78 == '\x03') {
LAB_0012ac1e:
    local_68.array_.storage_ = local_b8.array_.storage_;
    local_68._8_8_ = local_b8._8_8_;
    local_b8.array_.storage_ = (Value<char> *)0x0;
    local_b8._8_8_ = 0;
    local_58 = 2;
    Array<Qentem::Value<char>_>::operator+=(&local_88.array_,(Value<char> *)&local_68.array_);
    Value<char>::~Value((Value<char> *)&local_68.array_);
  }
  else {
    if (local_78 != '\x02') {
      Value<char>::reset((Value<char> *)&local_88.array_);
      local_78 = '\x03';
      goto LAB_0012ac1e;
    }
    HArray<Qentem::String<char>,_Qentem::Value<char>_>::operator+=
              ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_88.array_,
               (HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_b8.array_);
  }
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  ~HashTable((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              *)&local_b8.array_);
  local_b8.array_.storage_ = (Value<char> *)0x0;
  local_b8._8_8_ = 0;
  if (local_78 == '\x03') {
LAB_0012ac94:
    local_68.array_.storage_ = local_b8.array_.storage_;
    local_68._8_8_ = local_b8._8_8_;
    local_b8.array_.storage_ = (Value<char> *)0x0;
    local_b8._8_8_ = 0;
    local_58 = 2;
    Array<Qentem::Value<char>_>::operator+=(&local_88.array_,(Value<char> *)&local_68.array_);
    Value<char>::~Value((Value<char> *)&local_68.array_);
  }
  else {
    if (local_78 != '\x02') {
      Value<char>::reset((Value<char> *)&local_88.array_);
      local_78 = '\x03';
      goto LAB_0012ac94;
    }
    HArray<Qentem::String<char>,_Qentem::Value<char>_>::operator+=
              ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_88.array_,
               (HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_b8.array_);
  }
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  ~HashTable((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              *)&local_b8.array_);
  local_b8.array_.storage_ = (Value<char> *)0x0;
  local_b8._8_8_ = 0;
  if (local_78 == '\x03') {
LAB_0012ad0a:
    local_68.array_.storage_ = local_b8.array_.storage_;
    local_68._8_8_ = local_b8._8_8_;
    local_b8.array_.storage_ = (Value<char> *)0x0;
    local_b8._8_8_ = 0;
    local_58 = 2;
    Array<Qentem::Value<char>_>::operator+=(&local_88.array_,(Value<char> *)&local_68.array_);
    Value<char>::~Value((Value<char> *)&local_68.array_);
  }
  else {
    if (local_78 != '\x02') {
      Value<char>::reset((Value<char> *)&local_88.array_);
      local_78 = '\x03';
      goto LAB_0012ad0a;
    }
    HArray<Qentem::String<char>,_Qentem::Value<char>_>::operator+=
              ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_88.array_,
               (HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_b8.array_);
  }
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  ~HashTable((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              *)&local_b8.array_);
  local_b8.array_.storage_ = (Value<char> *)0x0;
  local_b8._8_8_ = 0;
  if (local_78 == '\x03') {
LAB_0012ad80:
    local_68.array_.storage_ = local_b8.array_.storage_;
    local_68._8_8_ = local_b8._8_8_;
    local_b8.array_.storage_ = (Value<char> *)0x0;
    local_b8._8_8_ = 0;
    local_58 = 2;
    Array<Qentem::Value<char>_>::operator+=(&local_88.array_,(Value<char> *)&local_68.array_);
    Value<char>::~Value((Value<char> *)&local_68.array_);
  }
  else {
    if (local_78 != '\x02') {
      Value<char>::reset((Value<char> *)&local_88.array_);
      local_78 = '\x03';
      goto LAB_0012ad80;
    }
    HArray<Qentem::String<char>,_Qentem::Value<char>_>::operator+=
              ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_88.array_,
               (HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_b8.array_);
  }
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  ~HashTable((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              *)&local_b8.array_);
  pVVar13 = Value<char>::operator[]((Value<char> *)&local_88.array_,0);
  if (pVVar13->type_ != Object) {
    Value<char>::reset(pVVar13);
    pVVar13->type_ = Object;
  }
  pVVar13 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar13,"year",4);
  Value<char>::reset(pVVar13);
  (pVVar13->field_0).array_.storage_ = (Value<char> *)0x7e3;
  pVVar13->type_ = IntLong;
  pVVar13 = Value<char>::operator[]((Value<char> *)&local_88.array_,1);
  if (pVVar13->type_ != Object) {
    Value<char>::reset(pVVar13);
    pVVar13->type_ = Object;
  }
  pVVar13 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar13,"year",4);
  Value<char>::reset(pVVar13);
  (pVVar13->field_0).array_.storage_ = (Value<char> *)0x7e4;
  pVVar13->type_ = IntLong;
  pVVar13 = Value<char>::operator[]((Value<char> *)&local_88.array_,2);
  if (pVVar13->type_ != Object) {
    Value<char>::reset(pVVar13);
    pVVar13->type_ = Object;
  }
  pVVar13 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar13,"year",4);
  Value<char>::reset(pVVar13);
  (pVVar13->field_0).array_.storage_ = (Value<char> *)0x7e1;
  pVVar13->type_ = IntLong;
  pVVar13 = Value<char>::operator[]((Value<char> *)&local_88.array_,3);
  if (pVVar13->type_ != Object) {
    Value<char>::reset(pVVar13);
    pVVar13->type_ = Object;
  }
  pVVar13 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar13,"year",4);
  Value<char>::reset(pVVar13);
  (pVVar13->field_0).array_.storage_ = (Value<char> *)0x7e4;
  pVVar13->type_ = IntLong;
  pVVar13 = Value<char>::operator[]((Value<char> *)&local_88.array_,4);
  if (pVVar13->type_ != Object) {
    Value<char>::reset(pVVar13);
    pVVar13->type_ = Object;
  }
  pVVar13 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar13,"year",4);
  Value<char>::reset(pVVar13);
  (pVVar13->field_0).array_.storage_ = (Value<char> *)0x7e2;
  pVVar13->type_ = IntLong;
  pVVar13 = Value<char>::operator[]((Value<char> *)&local_88.array_,5);
  if (pVVar13->type_ != Object) {
    Value<char>::reset(pVVar13);
    pVVar13->type_ = Object;
  }
  pVVar13 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar13,"year",4);
  Value<char>::reset(pVVar13);
  (pVVar13->field_0).array_.storage_ = (Value<char> *)0x7e4;
  pVVar13->type_ = IntLong;
  pVVar13 = Value<char>::operator[]((Value<char> *)&local_88.array_,6);
  if (pVVar13->type_ != Object) {
    Value<char>::reset(pVVar13);
    pVVar13->type_ = Object;
  }
  pVVar13 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar13,"year",4);
  Value<char>::reset(pVVar13);
  (pVVar13->field_0).array_.storage_ = (Value<char> *)0x7e2;
  pVVar13->type_ = IntLong;
  pVVar13 = Value<char>::operator[]((Value<char> *)&local_88.array_,0);
  if (pVVar13->type_ != Object) {
    Value<char>::reset(pVVar13);
    pVVar13->type_ = Object;
  }
  pVVar13 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar13,"month",5);
  Value<char>::reset(pVVar13);
  (pVVar13->field_0).array_.storage_ = (Value<char> *)0x4;
  pVVar13->type_ = IntLong;
  pVVar13 = Value<char>::operator[]((Value<char> *)&local_88.array_,1);
  if (pVVar13->type_ != Object) {
    Value<char>::reset(pVVar13);
    pVVar13->type_ = Object;
  }
  pVVar13 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar13,"month",5);
  Value<char>::reset(pVVar13);
  (pVVar13->field_0).array_.storage_ = (Value<char> *)0x5;
  pVVar13->type_ = IntLong;
  pVVar13 = Value<char>::operator[]((Value<char> *)&local_88.array_,2);
  if (pVVar13->type_ != Object) {
    Value<char>::reset(pVVar13);
    pVVar13->type_ = Object;
  }
  pVVar13 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar13,"month",5);
  Value<char>::reset(pVVar13);
  (pVVar13->field_0).array_.storage_ = (Value<char> *)0x1;
  pVVar13->type_ = IntLong;
  pVVar13 = Value<char>::operator[]((Value<char> *)&local_88.array_,3);
  if (pVVar13->type_ != Object) {
    Value<char>::reset(pVVar13);
    pVVar13->type_ = Object;
  }
  pVVar13 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar13,"month",5);
  Value<char>::reset(pVVar13);
  (pVVar13->field_0).array_.storage_ = (Value<char> *)0x6;
  pVVar13->type_ = IntLong;
  pVVar13 = Value<char>::operator[]((Value<char> *)&local_88.array_,4);
  if (pVVar13->type_ != Object) {
    Value<char>::reset(pVVar13);
    pVVar13->type_ = Object;
  }
  pVVar13 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar13,"month",5);
  Value<char>::reset(pVVar13);
  (pVVar13->field_0).array_.storage_ = (Value<char> *)0x2;
  pVVar13->type_ = IntLong;
  pVVar13 = Value<char>::operator[]((Value<char> *)&local_88.array_,5);
  if (pVVar13->type_ != Object) {
    Value<char>::reset(pVVar13);
    pVVar13->type_ = Object;
  }
  pVVar13 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar13,"month",5);
  Value<char>::reset(pVVar13);
  (pVVar13->field_0).array_.storage_ = (Value<char> *)0x7;
  pVVar13->type_ = IntLong;
  pVVar13 = Value<char>::operator[]((Value<char> *)&local_88.array_,6);
  if (pVVar13->type_ != Object) {
    Value<char>::reset(pVVar13);
    pVVar13->type_ = Object;
  }
  pVVar13 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar13,"month",5);
  Value<char>::reset(pVVar13);
  (pVVar13->field_0).array_.storage_ = (Value<char> *)0x3;
  pVVar13->type_ = IntLong;
  local_a8 = 0;
  local_b8.array_.storage_ = (Value<char> *)0x0;
  local_b8._8_8_ = 0;
  Value<char>::GroupBy((Value<char> *)&local_88.array_,(Value<char> *)&local_b8.array_,"year",4);
  Value<char>::Sort((Value<char> *)&local_b8.array_,true);
  pSVar14 = Value<char>::Stringify<Qentem::StringStream<char>>
                      ((Value<char> *)&local_b8.array_,&local_48,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[122]>
            (test,pSVar14,
             (char (*) [122])
             "{\"2017\":[{\"month\":1}],\"2018\":[{\"month\":2},{\"month\":3}],\"2019\":[{\"month\":4}],\"2020\":[{\"month\":5},{\"month\":6},{\"month\":7}]}"
             ,0x1663);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  Value<char>::Sort((Value<char> *)&local_b8.array_,false);
  pSVar14 = Value<char>::Stringify<Qentem::StringStream<char>>
                      ((Value<char> *)&local_b8.array_,&local_48,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[122]>
            (test,pSVar14,
             (char (*) [122])
             "{\"2020\":[{\"month\":5},{\"month\":6},{\"month\":7}],\"2019\":[{\"month\":4}],\"2018\":[{\"month\":2},{\"month\":3}],\"2017\":[{\"month\":1}]}"
             ,0x166b);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  Value<char>::reset((Value<char> *)&local_88.array_);
  local_78 = 0;
  Value<char>::reset((Value<char> *)&local_b8.array_);
  local_a8 = 0;
  Value<char>::GroupBy((Value<char> *)&local_88.array_,(Value<char> *)&local_b8.array_,"year",4);
  pSVar14 = Value<char>::Stringify<Qentem::StringStream<char>>
                      ((Value<char> *)&local_b8.array_,&local_48,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[1]>(test,pSVar14,(char (*) [1])0x13d179,0x1671);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  pVVar13 = Value<char>::operator[]((Value<char> *)&local_88.array_,0);
  if (pVVar13->type_ != Object) {
    Value<char>::reset(pVVar13);
    pVVar13->type_ = Object;
  }
  pVVar13 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar13,"year1",5);
  Value<char>::reset(pVVar13);
  (pVVar13->field_0).array_.storage_ = (Value<char> *)0x7e3;
  pVVar13->type_ = IntLong;
  pVVar13 = Value<char>::operator[]((Value<char> *)&local_88.array_,1);
  if (pVVar13->type_ != Object) {
    Value<char>::reset(pVVar13);
    pVVar13->type_ = Object;
  }
  pVVar13 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar13,"year1",5);
  Value<char>::reset(pVVar13);
  (pVVar13->field_0).array_.storage_ = (Value<char> *)0x7e4;
  pVVar13->type_ = IntLong;
  pVVar13 = Value<char>::operator[]((Value<char> *)&local_88.array_,2);
  if (pVVar13->type_ != Object) {
    Value<char>::reset(pVVar13);
    pVVar13->type_ = Object;
  }
  pVVar13 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar13,"year1",5);
  Value<char>::reset(pVVar13);
  (pVVar13->field_0).array_.storage_ = (Value<char> *)0x7e1;
  pVVar13->type_ = IntLong;
  pVVar13 = Value<char>::operator[]((Value<char> *)&local_88.array_,3);
  if (pVVar13->type_ != Object) {
    Value<char>::reset(pVVar13);
    pVVar13->type_ = Object;
  }
  pVVar13 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar13,"year1",5);
  Value<char>::reset(pVVar13);
  (pVVar13->field_0).array_.storage_ = (Value<char> *)0x7e4;
  pVVar13->type_ = IntLong;
  pVVar13 = Value<char>::operator[]((Value<char> *)&local_88.array_,4);
  if (pVVar13->type_ != Object) {
    Value<char>::reset(pVVar13);
    pVVar13->type_ = Object;
  }
  pVVar13 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar13,"year1",5);
  Value<char>::reset(pVVar13);
  (pVVar13->field_0).array_.storage_ = (Value<char> *)0x7e2;
  pVVar13->type_ = IntLong;
  pVVar13 = Value<char>::operator[]((Value<char> *)&local_88.array_,5);
  if (pVVar13->type_ != Object) {
    Value<char>::reset(pVVar13);
    pVVar13->type_ = Object;
  }
  pVVar13 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar13,"year1",5);
  Value<char>::reset(pVVar13);
  (pVVar13->field_0).array_.storage_ = (Value<char> *)0x7e4;
  pVVar13->type_ = IntLong;
  pVVar13 = Value<char>::operator[]((Value<char> *)&local_88.array_,6);
  if (pVVar13->type_ != Object) {
    Value<char>::reset(pVVar13);
    pVVar13->type_ = Object;
  }
  pVVar13 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar13,"year1",5);
  Value<char>::reset(pVVar13);
  (pVVar13->field_0).array_.storage_ = (Value<char> *)0x7e2;
  pVVar13->type_ = IntLong;
  pVVar13 = Value<char>::operator[]((Value<char> *)&local_88.array_,0);
  if (pVVar13->type_ != Object) {
    Value<char>::reset(pVVar13);
    pVVar13->type_ = Object;
  }
  pVVar13 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar13,"month",5);
  Value<char>::reset(pVVar13);
  (pVVar13->field_0).array_.storage_ = (Value<char> *)0x4;
  pVVar13->type_ = IntLong;
  pVVar13 = Value<char>::operator[]((Value<char> *)&local_88.array_,1);
  if (pVVar13->type_ != Object) {
    Value<char>::reset(pVVar13);
    pVVar13->type_ = Object;
  }
  pVVar13 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar13,"month",5);
  Value<char>::reset(pVVar13);
  (pVVar13->field_0).array_.storage_ = (Value<char> *)0x5;
  pVVar13->type_ = IntLong;
  pVVar13 = Value<char>::operator[]((Value<char> *)&local_88.array_,2);
  if (pVVar13->type_ != Object) {
    Value<char>::reset(pVVar13);
    pVVar13->type_ = Object;
  }
  pVVar13 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar13,"month",5);
  Value<char>::reset(pVVar13);
  (pVVar13->field_0).array_.storage_ = (Value<char> *)0x1;
  pVVar13->type_ = IntLong;
  pVVar13 = Value<char>::operator[]((Value<char> *)&local_88.array_,3);
  if (pVVar13->type_ != Object) {
    Value<char>::reset(pVVar13);
    pVVar13->type_ = Object;
  }
  pVVar13 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar13,"month",5);
  Value<char>::reset(pVVar13);
  (pVVar13->field_0).array_.storage_ = (Value<char> *)0x6;
  pVVar13->type_ = IntLong;
  pVVar13 = Value<char>::operator[]((Value<char> *)&local_88.array_,4);
  if (pVVar13->type_ != Object) {
    Value<char>::reset(pVVar13);
    pVVar13->type_ = Object;
  }
  pVVar13 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar13,"month",5);
  Value<char>::reset(pVVar13);
  (pVVar13->field_0).array_.storage_ = (Value<char> *)0x2;
  pVVar13->type_ = IntLong;
  pVVar13 = Value<char>::operator[]((Value<char> *)&local_88.array_,5);
  if (pVVar13->type_ != Object) {
    Value<char>::reset(pVVar13);
    pVVar13->type_ = Object;
  }
  pVVar13 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar13,"month",5);
  Value<char>::reset(pVVar13);
  (pVVar13->field_0).array_.storage_ = (Value<char> *)0x7;
  pVVar13->type_ = IntLong;
  pVVar13 = Value<char>::operator[]((Value<char> *)&local_88.array_,6);
  if (pVVar13->type_ != Object) {
    Value<char>::reset(pVVar13);
    pVVar13->type_ = Object;
  }
  pVVar13 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar13,"month",5);
  Value<char>::reset(pVVar13);
  (pVVar13->field_0).array_.storage_ = (Value<char> *)0x3;
  pVVar13->type_ = IntLong;
  Value<char>::GroupBy((Value<char> *)&local_88.array_,(Value<char> *)&local_b8.array_,"year",4);
  pSVar14 = Value<char>::Stringify<Qentem::StringStream<char>>
                      ((Value<char> *)&local_b8.array_,&local_48,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[3]>(test,pSVar14,(char (*) [3])"{}",0x1685);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  Value<char>::reset((Value<char> *)&local_88.array_);
  local_78 = 0;
  pVVar13 = Value<char>::operator[]((Value<char> *)&local_88.array_,0);
  if (pVVar13->type_ != Object) {
    Value<char>::reset(pVVar13);
    pVVar13->type_ = Object;
  }
  pVVar13 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar13,"year",4);
  Value<char>::reset(pVVar13);
  (pVVar13->field_0).array_.storage_ = (Value<char> *)0x7e3;
  pVVar13->type_ = IntLong;
  pVVar13 = Value<char>::operator[]((Value<char> *)&local_88.array_,1);
  if (pVVar13->type_ != Object) {
    Value<char>::reset(pVVar13);
    pVVar13->type_ = Object;
  }
  pVVar13 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar13,"year",4);
  Value<char>::reset(pVVar13);
  (pVVar13->field_0).array_.storage_ = (Value<char> *)0x7e4;
  pVVar13->type_ = IntLong;
  pVVar13 = Value<char>::operator[]((Value<char> *)&local_88.array_,2);
  if (pVVar13->type_ != Object) {
    Value<char>::reset(pVVar13);
    pVVar13->type_ = Object;
  }
  HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
            ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar13,"year",4);
  pVVar13 = Value<char>::operator[]((Value<char> *)&local_88.array_,0);
  if (pVVar13->type_ != Object) {
    Value<char>::reset(pVVar13);
    pVVar13->type_ = Object;
  }
  pVVar13 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar13,"month",5);
  Value<char>::reset(pVVar13);
  (pVVar13->field_0).array_.storage_ = (Value<char> *)0x4;
  pVVar13->type_ = IntLong;
  pVVar13 = Value<char>::operator[]((Value<char> *)&local_88.array_,1);
  if (pVVar13->type_ != Object) {
    Value<char>::reset(pVVar13);
    pVVar13->type_ = Object;
  }
  pVVar13 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar13,"month",5);
  Value<char>::reset(pVVar13);
  (pVVar13->field_0).array_.storage_ = (Value<char> *)0x5;
  pVVar13->type_ = IntLong;
  pVVar13 = Value<char>::operator[]((Value<char> *)&local_88.array_,2);
  if (pVVar13->type_ != Object) {
    Value<char>::reset(pVVar13);
    pVVar13->type_ = Object;
  }
  pVVar13 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar13,"month",5);
  Value<char>::reset(pVVar13);
  (pVVar13->field_0).array_.storage_ = (Value<char> *)0x1;
  pVVar13->type_ = IntLong;
  bVar12 = Value<char>::GroupBy
                     ((Value<char> *)&local_88.array_,(Value<char> *)&local_b8.array_,"year",4);
  QTest::IsFalse(test,bVar12,0x1693);
  pVVar13 = Value<char>::operator[]((Value<char> *)&local_88.array_,2);
  Value<char>::reset(pVVar13);
  pVVar13->type_ = Undefined;
  Value<char>::GroupBy((Value<char> *)&local_88.array_,(Value<char> *)&local_b8.array_,"year",4);
  bVar12 = Value<char>::GroupBy
                     ((Value<char> *)&local_88.array_,(Value<char> *)&local_b8.array_,"year",4);
  QTest::IsFalse(test,bVar12,0x1697);
  local_68.array_.storage_ = (Value<char> *)0x0;
  local_68._8_8_ = 0;
  pVVar13 = Value<char>::operator[]((Value<char> *)&local_88.array_,2);
  if (pVVar13->type_ != Object) {
    Value<char>::reset(pVVar13);
    pVVar13->type_ = Object;
  }
  pVVar13 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)pVVar13,"year",4);
  Value<char>::reset(pVVar13);
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  operator=((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
             *)pVVar13,
            (HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
             *)&local_68.array_);
  pVVar13->type_ = Object;
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  ~HashTable((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              *)&local_68.array_);
  bVar12 = Value<char>::GroupBy
                     ((Value<char> *)&local_88.array_,(Value<char> *)&local_b8.array_,"year",4);
  QTest::IsFalse(test,bVar12,0x169a);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  Value<char>::reset((Value<char> *)&local_88.array_);
  local_78 = 0;
  Value<char>::reset((Value<char> *)&local_b8.array_);
  local_a8 = 0;
  Value<char>::reset((Value<char> *)&local_b8.array_);
  local_a8 = '\x03';
  local_68.number_ = (QNumber64)0x4;
  local_58 = 5;
  Array<Qentem::Value<char>_>::operator+=(&local_b8.array_,(Value<char> *)&local_68.array_);
  Value<char>::~Value((Value<char> *)&local_68.array_);
  if (local_a8 != '\x03') {
    Value<char>::reset((Value<char> *)&local_b8.array_);
    local_a8 = '\x03';
  }
  local_68.number_ = (QNumber64)0x1;
  local_58 = 5;
  Array<Qentem::Value<char>_>::operator+=(&local_b8.array_,(Value<char> *)&local_68.array_);
  Value<char>::~Value((Value<char> *)&local_68.array_);
  if (local_a8 != '\x03') {
    Value<char>::reset((Value<char> *)&local_b8.array_);
    local_a8 = '\x03';
  }
  local_68.number_ = (QNumber64)0x3;
  local_58 = 5;
  Array<Qentem::Value<char>_>::operator+=(&local_b8.array_,(Value<char> *)&local_68.array_);
  Value<char>::~Value((Value<char> *)&local_68.array_);
  if (local_a8 != '\x03') {
    Value<char>::reset((Value<char> *)&local_b8.array_);
    local_a8 = '\x03';
  }
  local_68.number_ = (QNumber64)0x5;
  local_58 = 5;
  Array<Qentem::Value<char>_>::operator+=(&local_b8.array_,(Value<char> *)&local_68.array_);
  Value<char>::~Value((Value<char> *)&local_68.array_);
  if (local_a8 != '\x03') {
    Value<char>::reset((Value<char> *)&local_b8.array_);
    local_a8 = '\x03';
  }
  local_68.number_ = (QNumber64)0x2;
  local_58 = 5;
  Array<Qentem::Value<char>_>::operator+=(&local_b8.array_,(Value<char> *)&local_68.array_);
  Value<char>::~Value((Value<char> *)&local_68.array_);
  if (local_a8 != '\x03') {
    Value<char>::reset((Value<char> *)&local_b8.array_);
    local_a8 = '\x03';
  }
  local_68.number_ = (QNumber64)0x7;
  local_58 = 5;
  Array<Qentem::Value<char>_>::operator+=(&local_b8.array_,(Value<char> *)&local_68.array_);
  Value<char>::~Value((Value<char> *)&local_68.array_);
  if (local_a8 != '\x03') {
    Value<char>::reset((Value<char> *)&local_b8.array_);
    local_a8 = '\x03';
  }
  local_68.number_ = (QNumber64)0x6;
  local_58 = 5;
  Array<Qentem::Value<char>_>::operator+=(&local_b8.array_,(Value<char> *)&local_68.array_);
  Value<char>::~Value((Value<char> *)&local_68.array_);
  Value<char>::reset((Value<char> *)&local_88.array_);
  Value<char>::copyValue((Value<char> *)&local_88.array_,(Value<char> *)&local_b8.array_);
  Value<char>::Sort((Value<char> *)&local_88.array_,true);
  pSVar14 = Value<char>::Stringify<Qentem::StringStream<char>>
                      ((Value<char> *)&local_88.array_,&local_48,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[16]>
            (test,pSVar14,(char (*) [16])"[1,2,3,4,5,6,7]",0x16ad);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  Value<char>::reset((Value<char> *)&local_88.array_);
  Value<char>::copyValue((Value<char> *)&local_88.array_,(Value<char> *)&local_b8.array_);
  Value<char>::Sort((Value<char> *)&local_88.array_,false);
  pSVar14 = Value<char>::Stringify<Qentem::StringStream<char>>
                      ((Value<char> *)&local_88.array_,&local_48,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[16]>
            (test,pSVar14,(char (*) [16])"[7,6,5,4,3,2,1]",0x16b4);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  Value<char>::reset((Value<char> *)&local_88.array_);
  local_78 = 0;
  Value<char>::reset((Value<char> *)&local_b8.array_);
  local_a8 = 0;
  Value<char>::reset((Value<char> *)&local_b8.array_);
  local_a8 = '\x03';
  local_68.array_.storage_ = (Value<char> *)0x401599999999999a;
  local_58 = 7;
  Array<Qentem::Value<char>_>::operator+=(&local_b8.array_,(Value<char> *)&local_68.array_);
  Value<char>::~Value((Value<char> *)&local_68.array_);
  String<char>::String((String<char> *)&local_98,"str");
  if (local_a8 != '\x03') {
    Value<char>::reset((Value<char> *)&local_b8.array_);
    local_a8 = '\x03';
  }
  local_68.number_ = (QNumber64)local_98.hashTable_;
  local_68.array_.index_ = local_98.index_;
  local_98.index_ = 0;
  auVar1._8_8_ = 0;
  auVar1._0_4_ = local_98.index_;
  auVar1._4_4_ = local_98.capacity_;
  local_98 = (HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              )(auVar1 << 0x40);
  local_58 = 4;
  Array<Qentem::Value<char>_>::operator+=(&local_b8.array_,(Value<char> *)&local_68.array_);
  Value<char>::~Value((Value<char> *)&local_68.array_);
  pSVar9 = local_98.hashTable_;
  if (local_98.hashTable_ != (SizeT *)0x0) {
    MemoryRecord::RemoveAllocation(local_98.hashTable_);
  }
  operator_delete(pSVar9);
  local_98 = (HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              )ZEXT816(0);
  if (local_a8 != '\x03') {
    Value<char>::reset((Value<char> *)&local_b8.array_);
    local_a8 = '\x03';
  }
  if (local_98.index_ == 0) {
    local_68.number_ = (QNumber64)local_98.hashTable_;
    local_68._8_8_ = local_98._8_8_;
    local_98 = (HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
                )ZEXT816(0);
    local_58 = 3;
    Array<Qentem::Value<char>_>::operator+=(&local_b8.array_,(Value<char> *)&local_68.array_);
    Value<char>::~Value((Value<char> *)&local_68.array_);
  }
  else {
    Array<Qentem::Value<char>_>::operator+=
              (&local_b8.array_,(Array<Qentem::Value<char>_> *)&local_98);
  }
  Array<Qentem::Value<char>_>::~Array((Array<Qentem::Value<char>_> *)&local_98);
  if (local_a8 != '\x03') {
    Value<char>::reset((Value<char> *)&local_b8.array_);
    local_a8 = '\x03';
  }
  local_68.array_.storage_ = (Value<char> *)0x0;
  local_68._8_8_ = 0;
  local_58 = 10;
  Array<Qentem::Value<char>_>::operator+=(&local_b8.array_,(Value<char> *)&local_68.array_);
  Value<char>::~Value((Value<char> *)&local_68.array_);
  if (local_a8 != '\x03') {
    Value<char>::reset((Value<char> *)&local_b8.array_);
    local_a8 = '\x03';
  }
  local_68.array_.storage_ = (Value<char> *)0x0;
  local_68._8_8_ = 0;
  local_58 = 8;
  Array<Qentem::Value<char>_>::operator+=(&local_b8.array_,(Value<char> *)&local_68.array_);
  Value<char>::~Value((Value<char> *)&local_68.array_);
  local_98 = (HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              )ZEXT816(0);
  if (local_a8 != '\x03') {
    if (local_a8 == '\x02') {
      HArray<Qentem::String<char>,_Qentem::Value<char>_>::operator+=
                ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_b8.array_,
                 (HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_98);
      goto LAB_0012bf3f;
    }
    Value<char>::reset((Value<char> *)&local_b8.array_);
    local_a8 = '\x03';
  }
  local_68.number_ = (QNumber64)local_98.hashTable_;
  local_68.array_.index_ = local_98.index_;
  local_68.array_.capacity_ = local_98.capacity_;
  local_98 = (HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              )(ZEXT816(0) << 0x20);
  local_58 = 2;
  Array<Qentem::Value<char>_>::operator+=(&local_b8.array_,(Value<char> *)&local_68.array_);
  Value<char>::~Value((Value<char> *)&local_68.array_);
LAB_0012bf3f:
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  ~HashTable(&local_98);
  if (local_a8 != '\x03') {
    Value<char>::reset((Value<char> *)&local_b8.array_);
    local_a8 = '\x03';
  }
  local_68.array_.storage_ = (Value<char> *)0x0;
  local_68._8_8_ = 0;
  local_58 = 9;
  Array<Qentem::Value<char>_>::operator+=(&local_b8.array_,(Value<char> *)&local_68.array_);
  Value<char>::~Value((Value<char> *)&local_68.array_);
  Value<char>::reset((Value<char> *)&local_88.array_);
  Value<char>::copyValue((Value<char> *)&local_88.array_,(Value<char> *)&local_b8.array_);
  Value<char>::Sort((Value<char> *)&local_88.array_,true);
  pSVar14 = Value<char>::Stringify<Qentem::StringStream<char>>
                      ((Value<char> *)&local_88.array_,&local_48,2);
  QTest::IsEqual<Qentem::StringStream<char>,char[34]>
            (test,pSVar14,(char (*) [34])"[{},[],\"str\",5.4,true,false,null]",0x16c7);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  Value<char>::reset((Value<char> *)&local_88.array_);
  Value<char>::copyValue((Value<char> *)&local_88.array_,(Value<char> *)&local_b8.array_);
  Value<char>::Sort((Value<char> *)&local_88.array_,false);
  pSVar14 = Value<char>::Stringify<Qentem::StringStream<char>>
                      ((Value<char> *)&local_88.array_,&local_48,2);
  QTest::IsEqual<Qentem::StringStream<char>,char[34]>
            (test,pSVar14,(char (*) [34])"[null,false,true,5.4,\"str\",[],{}]",0x16cd);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  Value<char>::reset((Value<char> *)&local_88.array_);
  local_78 = 0;
  Value<char>::reset((Value<char> *)&local_b8.array_);
  local_a8 = 0;
  Value<char>::reset((Value<char> *)&local_b8.array_);
  local_a8 = '\x03';
  local_68.number_ = (QNumber64)0xfffffffffffffffc;
  local_58 = 6;
  Array<Qentem::Value<char>_>::operator+=(&local_b8.array_,(Value<char> *)&local_68.array_);
  Value<char>::~Value((Value<char> *)&local_68.array_);
  if (local_a8 != '\x03') {
    Value<char>::reset((Value<char> *)&local_b8.array_);
    local_a8 = '\x03';
  }
  local_68.number_ = (QNumber64)0xffffffffffffffff;
  local_58 = 6;
  Array<Qentem::Value<char>_>::operator+=(&local_b8.array_,(Value<char> *)&local_68.array_);
  Value<char>::~Value((Value<char> *)&local_68.array_);
  if (local_a8 != '\x03') {
    Value<char>::reset((Value<char> *)&local_b8.array_);
    local_a8 = '\x03';
  }
  local_68.number_ = (QNumber64)0xfffffffffffffffd;
  local_58 = 6;
  Array<Qentem::Value<char>_>::operator+=(&local_b8.array_,(Value<char> *)&local_68.array_);
  Value<char>::~Value((Value<char> *)&local_68.array_);
  if (local_a8 != '\x03') {
    Value<char>::reset((Value<char> *)&local_b8.array_);
    local_a8 = '\x03';
  }
  local_68.number_ = (QNumber64)0xfffffffffffffffb;
  local_58 = 6;
  Array<Qentem::Value<char>_>::operator+=(&local_b8.array_,(Value<char> *)&local_68.array_);
  Value<char>::~Value((Value<char> *)&local_68.array_);
  if (local_a8 != '\x03') {
    Value<char>::reset((Value<char> *)&local_b8.array_);
    local_a8 = '\x03';
  }
  local_68.number_ = (QNumber64)0xfffffffffffffffe;
  local_58 = 6;
  Array<Qentem::Value<char>_>::operator+=(&local_b8.array_,(Value<char> *)&local_68.array_);
  Value<char>::~Value((Value<char> *)&local_68.array_);
  if (local_a8 != '\x03') {
    Value<char>::reset((Value<char> *)&local_b8.array_);
    local_a8 = '\x03';
  }
  local_68.number_ = (QNumber64)0xfffffffffffffff9;
  local_58 = 6;
  Array<Qentem::Value<char>_>::operator+=(&local_b8.array_,(Value<char> *)&local_68.array_);
  Value<char>::~Value((Value<char> *)&local_68.array_);
  if (local_a8 != '\x03') {
    Value<char>::reset((Value<char> *)&local_b8.array_);
    local_a8 = '\x03';
  }
  local_68.number_ = (QNumber64)0xfffffffffffffffa;
  local_58 = 6;
  Array<Qentem::Value<char>_>::operator+=(&local_b8.array_,(Value<char> *)&local_68.array_);
  Value<char>::~Value((Value<char> *)&local_68.array_);
  Value<char>::reset((Value<char> *)&local_88.array_);
  Value<char>::copyValue((Value<char> *)&local_88.array_,(Value<char> *)&local_b8.array_);
  Value<char>::Sort((Value<char> *)&local_88.array_,true);
  pSVar14 = Value<char>::Stringify<Qentem::StringStream<char>>
                      ((Value<char> *)&local_88.array_,&local_48,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[23]>
            (test,pSVar14,(char (*) [23])"[-7,-6,-5,-4,-3,-2,-1]",0x16e0);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  Value<char>::reset((Value<char> *)&local_88.array_);
  Value<char>::copyValue((Value<char> *)&local_88.array_,(Value<char> *)&local_b8.array_);
  Value<char>::Sort((Value<char> *)&local_88.array_,false);
  pSVar14 = Value<char>::Stringify<Qentem::StringStream<char>>
                      ((Value<char> *)&local_88.array_,&local_48,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[23]>
            (test,pSVar14,(char (*) [23])"[-1,-2,-3,-4,-5,-6,-7]",0x16e7);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  Value<char>::reset((Value<char> *)&local_88.array_);
  local_78 = 0;
  Value<char>::reset((Value<char> *)&local_b8.array_);
  local_a8 = 0;
  Value<char>::reset((Value<char> *)&local_b8.array_);
  local_a8 = '\x03';
  local_68.array_.storage_ = (Value<char> *)0x4012000000000000;
  local_58 = 7;
  Array<Qentem::Value<char>_>::operator+=(&local_b8.array_,(Value<char> *)&local_68.array_);
  Value<char>::~Value((Value<char> *)&local_68.array_);
  if (local_a8 != '\x03') {
    Value<char>::reset((Value<char> *)&local_b8.array_);
    local_a8 = '\x03';
  }
  local_68.number_ = (QNumber64)0x3ff8000000000000;
  local_58 = 7;
  Array<Qentem::Value<char>_>::operator+=(&local_b8.array_,(Value<char> *)&local_68.array_);
  Value<char>::~Value((Value<char> *)&local_68.array_);
  if (local_a8 != '\x03') {
    Value<char>::reset((Value<char> *)&local_b8.array_);
    local_a8 = '\x03';
  }
  local_68.array_.storage_ = (Value<char> *)0x400c000000000000;
  local_58 = 7;
  Array<Qentem::Value<char>_>::operator+=(&local_b8.array_,(Value<char> *)&local_68.array_);
  Value<char>::~Value((Value<char> *)&local_68.array_);
  if (local_a8 != '\x03') {
    Value<char>::reset((Value<char> *)&local_b8.array_);
    local_a8 = '\x03';
  }
  local_68.array_.storage_ = (Value<char> *)0x4016000000000000;
  local_58 = 7;
  Array<Qentem::Value<char>_>::operator+=(&local_b8.array_,(Value<char> *)&local_68.array_);
  Value<char>::~Value((Value<char> *)&local_68.array_);
  if (local_a8 != '\x03') {
    Value<char>::reset((Value<char> *)&local_b8.array_);
    local_a8 = '\x03';
  }
  local_68.array_.storage_ = (Value<char> *)0x4004000000000000;
  local_58 = 7;
  Array<Qentem::Value<char>_>::operator+=(&local_b8.array_,(Value<char> *)&local_68.array_);
  Value<char>::~Value((Value<char> *)&local_68.array_);
  if (local_a8 != '\x03') {
    Value<char>::reset((Value<char> *)&local_b8.array_);
    local_a8 = '\x03';
  }
  local_68.array_.storage_ = (Value<char> *)0x401e000000000000;
  local_58 = 7;
  Array<Qentem::Value<char>_>::operator+=(&local_b8.array_,(Value<char> *)&local_68.array_);
  Value<char>::~Value((Value<char> *)&local_68.array_);
  if (local_a8 != '\x03') {
    Value<char>::reset((Value<char> *)&local_b8.array_);
    local_a8 = '\x03';
  }
  local_68.array_.storage_ = (Value<char> *)0x401a000000000000;
  local_58 = 7;
  Array<Qentem::Value<char>_>::operator+=(&local_b8.array_,(Value<char> *)&local_68.array_);
  Value<char>::~Value((Value<char> *)&local_68.array_);
  Value<char>::reset((Value<char> *)&local_88.array_);
  Value<char>::copyValue((Value<char> *)&local_88.array_,(Value<char> *)&local_b8.array_);
  Value<char>::Sort((Value<char> *)&local_88.array_,true);
  pSVar14 = Value<char>::Stringify<Qentem::StringStream<char>>
                      ((Value<char> *)&local_88.array_,&local_48,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[30]>
            (test,pSVar14,(char (*) [30])"[1.5,2.5,3.5,4.5,5.5,6.5,7.5]",0x16fa);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  Value<char>::reset((Value<char> *)&local_88.array_);
  Value<char>::copyValue((Value<char> *)&local_88.array_,(Value<char> *)&local_b8.array_);
  Value<char>::Sort((Value<char> *)&local_88.array_,false);
  pSVar14 = Value<char>::Stringify<Qentem::StringStream<char>>
                      ((Value<char> *)&local_88.array_,&local_48,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[30]>
            (test,pSVar14,(char (*) [30])"[7.5,6.5,5.5,4.5,3.5,2.5,1.5]",0x1701);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  Value<char>::reset((Value<char> *)&local_88.array_);
  local_78 = 0;
  Value<char>::reset((Value<char> *)&local_b8.array_);
  local_a8 = '\0';
  String<char>::String((String<char> *)&local_98,"b");
  if (local_a8 != '\x03') {
    Value<char>::reset((Value<char> *)&local_b8.array_);
    local_a8 = '\x03';
  }
  local_68.number_ = (QNumber64)local_98.hashTable_;
  local_68.array_.index_ = local_98.index_;
  local_98.index_ = 0;
  auVar2._8_8_ = 0;
  auVar2._0_4_ = local_98.index_;
  auVar2._4_4_ = local_98.capacity_;
  local_98 = (HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              )(auVar2 << 0x40);
  local_58 = 4;
  Array<Qentem::Value<char>_>::operator+=(&local_b8.array_,(Value<char> *)&local_68.array_);
  Value<char>::~Value((Value<char> *)&local_68.array_);
  pSVar9 = local_98.hashTable_;
  if (local_98.hashTable_ != (SizeT *)0x0) {
    MemoryRecord::RemoveAllocation(local_98.hashTable_);
  }
  operator_delete(pSVar9);
  String<char>::String((String<char> *)&local_98,"a");
  if (local_a8 != '\x03') {
    Value<char>::reset((Value<char> *)&local_b8.array_);
    local_a8 = '\x03';
  }
  local_68.number_ = (QNumber64)local_98.hashTable_;
  local_68.array_.index_ = local_98.index_;
  local_98.index_ = 0;
  auVar3._8_8_ = 0;
  auVar3._0_4_ = local_98.index_;
  auVar3._4_4_ = local_98.capacity_;
  local_98 = (HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              )(auVar3 << 0x40);
  local_58 = 4;
  Array<Qentem::Value<char>_>::operator+=(&local_b8.array_,(Value<char> *)&local_68.array_);
  Value<char>::~Value((Value<char> *)&local_68.array_);
  pSVar9 = local_98.hashTable_;
  if (local_98.hashTable_ != (SizeT *)0x0) {
    MemoryRecord::RemoveAllocation(local_98.hashTable_);
  }
  operator_delete(pSVar9);
  String<char>::String((String<char> *)&local_98,"g");
  if (local_a8 != '\x03') {
    Value<char>::reset((Value<char> *)&local_b8.array_);
    local_a8 = '\x03';
  }
  local_68.number_ = (QNumber64)local_98.hashTable_;
  local_68.array_.index_ = local_98.index_;
  local_98.index_ = 0;
  auVar4._8_8_ = 0;
  auVar4._0_4_ = local_98.index_;
  auVar4._4_4_ = local_98.capacity_;
  local_98 = (HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              )(auVar4 << 0x40);
  local_58 = 4;
  Array<Qentem::Value<char>_>::operator+=(&local_b8.array_,(Value<char> *)&local_68.array_);
  Value<char>::~Value((Value<char> *)&local_68.array_);
  pSVar9 = local_98.hashTable_;
  if (local_98.hashTable_ != (SizeT *)0x0) {
    MemoryRecord::RemoveAllocation(local_98.hashTable_);
  }
  operator_delete(pSVar9);
  String<char>::String((String<char> *)&local_98,"f");
  if (local_a8 != '\x03') {
    Value<char>::reset((Value<char> *)&local_b8.array_);
    local_a8 = '\x03';
  }
  local_68.number_ = (QNumber64)local_98.hashTable_;
  local_68.array_.index_ = local_98.index_;
  local_98.index_ = 0;
  auVar5._8_8_ = 0;
  auVar5._0_4_ = local_98.index_;
  auVar5._4_4_ = local_98.capacity_;
  local_98 = (HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              )(auVar5 << 0x40);
  local_58 = 4;
  Array<Qentem::Value<char>_>::operator+=(&local_b8.array_,(Value<char> *)&local_68.array_);
  Value<char>::~Value((Value<char> *)&local_68.array_);
  pSVar9 = local_98.hashTable_;
  if (local_98.hashTable_ != (SizeT *)0x0) {
    MemoryRecord::RemoveAllocation(local_98.hashTable_);
  }
  operator_delete(pSVar9);
  String<char>::String((String<char> *)&local_98,"c");
  if (local_a8 != '\x03') {
    Value<char>::reset((Value<char> *)&local_b8.array_);
    local_a8 = '\x03';
  }
  local_68.number_ = (QNumber64)local_98.hashTable_;
  local_68.array_.index_ = local_98.index_;
  local_98.index_ = 0;
  auVar6._8_8_ = 0;
  auVar6._0_4_ = local_98.index_;
  auVar6._4_4_ = local_98.capacity_;
  local_98 = (HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              )(auVar6 << 0x40);
  local_58 = 4;
  Array<Qentem::Value<char>_>::operator+=(&local_b8.array_,(Value<char> *)&local_68.array_);
  Value<char>::~Value((Value<char> *)&local_68.array_);
  pSVar9 = local_98.hashTable_;
  if (local_98.hashTable_ != (SizeT *)0x0) {
    MemoryRecord::RemoveAllocation(local_98.hashTable_);
  }
  operator_delete(pSVar9);
  String<char>::String((String<char> *)&local_98,"e");
  if (local_a8 != '\x03') {
    Value<char>::reset((Value<char> *)&local_b8.array_);
    local_a8 = '\x03';
  }
  local_68.number_ = (QNumber64)local_98.hashTable_;
  local_68.array_.index_ = local_98.index_;
  local_98.index_ = 0;
  auVar7._8_8_ = 0;
  auVar7._0_4_ = local_98.index_;
  auVar7._4_4_ = local_98.capacity_;
  local_98 = (HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              )(auVar7 << 0x40);
  local_58 = 4;
  Array<Qentem::Value<char>_>::operator+=(&local_b8.array_,(Value<char> *)&local_68.array_);
  Value<char>::~Value((Value<char> *)&local_68.array_);
  pSVar9 = local_98.hashTable_;
  if (local_98.hashTable_ != (SizeT *)0x0) {
    MemoryRecord::RemoveAllocation(local_98.hashTable_);
  }
  operator_delete(pSVar9);
  String<char>::String((String<char> *)&local_98,"d");
  if (local_a8 != '\x03') {
    Value<char>::reset((Value<char> *)&local_b8.array_);
    local_a8 = '\x03';
  }
  local_68.number_ = (QNumber64)local_98.hashTable_;
  local_68.array_.index_ = local_98.index_;
  local_98.index_ = 0;
  auVar8._8_8_ = 0;
  auVar8._0_4_ = local_98.index_;
  auVar8._4_4_ = local_98.capacity_;
  local_98 = (HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              )(auVar8 << 0x40);
  local_58 = 4;
  Array<Qentem::Value<char>_>::operator+=(&local_b8.array_,(Value<char> *)&local_68.array_);
  Value<char>::~Value((Value<char> *)&local_68.array_);
  pSVar9 = local_98.hashTable_;
  if (local_98.hashTable_ != (SizeT *)0x0) {
    MemoryRecord::RemoveAllocation(local_98.hashTable_);
  }
  operator_delete(pSVar9);
  Value<char>::reset((Value<char> *)&local_88.array_);
  Value<char>::copyValue((Value<char> *)&local_88.array_,(Value<char> *)&local_b8.array_);
  Value<char>::Sort((Value<char> *)&local_88.array_,true);
  pSVar14 = Value<char>::Stringify<Qentem::StringStream<char>>
                      ((Value<char> *)&local_88.array_,&local_48,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[30]>
            (test,pSVar14,(char (*) [30])"[\"a\",\"b\",\"c\",\"d\",\"e\",\"f\",\"g\"]",0x1713);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  Value<char>::reset((Value<char> *)&local_88.array_);
  Value<char>::copyValue((Value<char> *)&local_88.array_,(Value<char> *)&local_b8.array_);
  Value<char>::Sort((Value<char> *)&local_88.array_,false);
  pSVar14 = Value<char>::Stringify<Qentem::StringStream<char>>
                      ((Value<char> *)&local_88.array_,&local_48,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[30]>
            (test,pSVar14,(char (*) [30])"[\"g\",\"f\",\"e\",\"d\",\"c\",\"b\",\"a\"]",0x171a);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  Value<char>::reset((Value<char> *)&local_88.array_);
  local_78 = 0;
  Value<char>::reset((Value<char> *)&local_b8.array_);
  local_a8 = 0;
  Value<char>::reset((Value<char> *)&local_b8.array_);
  local_a8 = '\x03';
  local_68.array_.storage_ = (Value<char> *)0x0;
  local_58 = 6;
  Array<Qentem::Value<char>_>::operator+=(&local_b8.array_,(Value<char> *)&local_68.array_);
  Value<char>::~Value((Value<char> *)&local_68.array_);
  if (local_a8 != '\x03') {
    Value<char>::reset((Value<char> *)&local_b8.array_);
    local_a8 = '\x03';
  }
  local_68.array_.storage_ = (Value<char> *)0x0;
  local_58 = 6;
  Array<Qentem::Value<char>_>::operator+=(&local_b8.array_,(Value<char> *)&local_68.array_);
  Value<char>::~Value((Value<char> *)&local_68.array_);
  if (local_a8 != '\x03') {
    Value<char>::reset((Value<char> *)&local_b8.array_);
    local_a8 = '\x03';
  }
  local_68.array_.storage_ = (Value<char> *)0x0;
  local_58 = 6;
  Array<Qentem::Value<char>_>::operator+=(&local_b8.array_,(Value<char> *)&local_68.array_);
  Value<char>::~Value((Value<char> *)&local_68.array_);
  pVVar13 = Value<char>::operator[]((Value<char> *)&local_88.array_,0);
  if (&pVVar13->field_0 != &local_b8) {
    Value<char>::reset(pVVar13);
    Value<char>::copyValue(pVVar13,(Value<char> *)&local_b8.array_);
  }
  if (local_a8 != '\x03') {
    Value<char>::reset((Value<char> *)&local_b8.array_);
    local_a8 = '\x03';
  }
  local_68.array_.storage_ = (Value<char> *)0x0;
  local_58 = 6;
  Array<Qentem::Value<char>_>::operator+=(&local_b8.array_,(Value<char> *)&local_68.array_);
  Value<char>::~Value((Value<char> *)&local_68.array_);
  if (local_a8 != '\x03') {
    Value<char>::reset((Value<char> *)&local_b8.array_);
    local_a8 = '\x03';
  }
  local_68.array_.storage_ = (Value<char> *)0x0;
  local_58 = 6;
  Array<Qentem::Value<char>_>::operator+=(&local_b8.array_,(Value<char> *)&local_68.array_);
  Value<char>::~Value((Value<char> *)&local_68.array_);
  pVVar13 = Value<char>::operator[]((Value<char> *)&local_88.array_,1);
  if (&pVVar13->field_0 != &local_b8) {
    Value<char>::reset(pVVar13);
    Value<char>::copyValue(pVVar13,(Value<char> *)&local_b8.array_);
  }
  Value<char>::Sort((Value<char> *)&local_88.array_,true);
  pSVar14 = Value<char>::Stringify<Qentem::StringStream<char>>
                      ((Value<char> *)&local_88.array_,&local_48,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[22]>
            (test,pSVar14,(char (*) [22])"[[0,0,0],[0,0,0,0,0]]",0x172d);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  Value<char>::reset((Value<char> *)&local_88.array_);
  local_78 = 0;
  Value<char>::reset((Value<char> *)&local_b8.array_);
  local_a8 = 0;
  Value<char>::reset((Value<char> *)&local_b8.array_);
  local_a8 = '\x03';
  local_68.array_.storage_ = (Value<char> *)0x0;
  local_58 = 6;
  Array<Qentem::Value<char>_>::operator+=(&local_b8.array_,(Value<char> *)&local_68.array_);
  Value<char>::~Value((Value<char> *)&local_68.array_);
  if (local_a8 != '\x03') {
    Value<char>::reset((Value<char> *)&local_b8.array_);
    local_a8 = '\x03';
  }
  local_68.array_.storage_ = (Value<char> *)0x0;
  local_58 = 6;
  Array<Qentem::Value<char>_>::operator+=(&local_b8.array_,(Value<char> *)&local_68.array_);
  Value<char>::~Value((Value<char> *)&local_68.array_);
  if (local_a8 != '\x03') {
    Value<char>::reset((Value<char> *)&local_b8.array_);
    local_a8 = '\x03';
  }
  local_68.array_.storage_ = (Value<char> *)0x0;
  local_58 = 6;
  Array<Qentem::Value<char>_>::operator+=(&local_b8.array_,(Value<char> *)&local_68.array_);
  Value<char>::~Value((Value<char> *)&local_68.array_);
  pVVar13 = Value<char>::operator[]((Value<char> *)&local_88.array_,0);
  if (&pVVar13->field_0 != &local_b8) {
    Value<char>::reset(pVVar13);
    Value<char>::copyValue(pVVar13,(Value<char> *)&local_b8.array_);
  }
  if (local_a8 != '\x03') {
    Value<char>::reset((Value<char> *)&local_b8.array_);
    local_a8 = '\x03';
  }
  local_68.array_.storage_ = (Value<char> *)0x0;
  local_58 = 6;
  Array<Qentem::Value<char>_>::operator+=(&local_b8.array_,(Value<char> *)&local_68.array_);
  Value<char>::~Value((Value<char> *)&local_68.array_);
  if (local_a8 != '\x03') {
    Value<char>::reset((Value<char> *)&local_b8.array_);
    local_a8 = '\x03';
  }
  local_68.array_.storage_ = (Value<char> *)0x0;
  local_58 = 6;
  Array<Qentem::Value<char>_>::operator+=(&local_b8.array_,(Value<char> *)&local_68.array_);
  Value<char>::~Value((Value<char> *)&local_68.array_);
  pVVar13 = Value<char>::operator[]((Value<char> *)&local_88.array_,1);
  if (&pVVar13->field_0 != &local_b8) {
    Value<char>::reset(pVVar13);
    Value<char>::copyValue(pVVar13,(Value<char> *)&local_b8.array_);
  }
  Value<char>::Sort((Value<char> *)&local_88.array_,false);
  pSVar14 = Value<char>::Stringify<Qentem::StringStream<char>>
                      ((Value<char> *)&local_88.array_,&local_48,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[22]>
            (test,pSVar14,(char (*) [22])"[[0,0,0,0,0],[0,0,0]]",0x173e);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  Value<char>::reset((Value<char> *)&local_88.array_);
  local_78 = 0;
  Value<char>::reset((Value<char> *)&local_b8.array_);
  local_a8 = 0;
  Value<char>::reset((Value<char> *)&local_b8.array_);
  local_a8 = '\x02';
  pVVar13 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_b8.array_,"a",1)
  ;
  Value<char>::reset(pVVar13);
  (pVVar13->field_0).array_.storage_ = (Value<char> *)0x0;
  pVVar13->type_ = IntLong;
  if (local_a8 != '\x02') {
    Value<char>::reset((Value<char> *)&local_b8.array_);
    local_a8 = '\x02';
  }
  pVVar13 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_b8.array_,"b",1)
  ;
  Value<char>::reset(pVVar13);
  (pVVar13->field_0).array_.storage_ = (Value<char> *)0x0;
  pVVar13->type_ = IntLong;
  if (local_a8 != '\x02') {
    Value<char>::reset((Value<char> *)&local_b8.array_);
    local_a8 = '\x02';
  }
  pVVar13 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_b8.array_,"c",1)
  ;
  Value<char>::reset(pVVar13);
  (pVVar13->field_0).array_.storage_ = (Value<char> *)0x0;
  pVVar13->type_ = IntLong;
  pVVar13 = Value<char>::operator[]((Value<char> *)&local_88.array_,0);
  if (&pVVar13->field_0 != &local_b8) {
    Value<char>::reset(pVVar13);
    Value<char>::copyValue(pVVar13,(Value<char> *)&local_b8.array_);
  }
  if (local_a8 != '\x02') {
    Value<char>::reset((Value<char> *)&local_b8.array_);
    local_a8 = '\x02';
  }
  pVVar13 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_b8.array_,"d",1)
  ;
  Value<char>::reset(pVVar13);
  (pVVar13->field_0).array_.storage_ = (Value<char> *)0x0;
  pVVar13->type_ = IntLong;
  if (local_a8 != '\x02') {
    Value<char>::reset((Value<char> *)&local_b8.array_);
    local_a8 = '\x02';
  }
  pVVar13 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_b8.array_,"e",1)
  ;
  Value<char>::reset(pVVar13);
  (pVVar13->field_0).array_.storage_ = (Value<char> *)0x0;
  pVVar13->type_ = IntLong;
  pVVar13 = Value<char>::operator[]((Value<char> *)&local_88.array_,1);
  if (&pVVar13->field_0 != &local_b8) {
    Value<char>::reset(pVVar13);
    Value<char>::copyValue(pVVar13,(Value<char> *)&local_b8.array_);
  }
  Value<char>::Sort((Value<char> *)&local_88.array_,true);
  pSVar14 = Value<char>::Stringify<Qentem::StringStream<char>>
                      ((Value<char> *)&local_88.array_,&local_48,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[54]>
            (test,pSVar14,
             (char (*) [54])"[{\"a\":0,\"b\":0,\"c\":0},{\"a\":0,\"b\":0,\"c\":0,\"d\":0,\"e\":0}]",
             0x1751);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  Value<char>::reset((Value<char> *)&local_88.array_);
  local_78 = 0;
  Value<char>::reset((Value<char> *)&local_b8.array_);
  local_a8 = 0;
  Value<char>::reset((Value<char> *)&local_b8.array_);
  local_a8 = '\x02';
  pVVar13 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_b8.array_,"a",1)
  ;
  Value<char>::reset(pVVar13);
  (pVVar13->field_0).array_.storage_ = (Value<char> *)0x0;
  pVVar13->type_ = IntLong;
  if (local_a8 != '\x02') {
    Value<char>::reset((Value<char> *)&local_b8.array_);
    local_a8 = '\x02';
  }
  pVVar13 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_b8.array_,"b",1)
  ;
  Value<char>::reset(pVVar13);
  (pVVar13->field_0).array_.storage_ = (Value<char> *)0x0;
  pVVar13->type_ = IntLong;
  if (local_a8 != '\x02') {
    Value<char>::reset((Value<char> *)&local_b8.array_);
    local_a8 = '\x02';
  }
  pVVar13 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_b8.array_,"c",1)
  ;
  Value<char>::reset(pVVar13);
  (pVVar13->field_0).array_.storage_ = (Value<char> *)0x0;
  pVVar13->type_ = IntLong;
  pVVar13 = Value<char>::operator[]((Value<char> *)&local_88.array_,0);
  if (&pVVar13->field_0 != &local_b8) {
    Value<char>::reset(pVVar13);
    Value<char>::copyValue(pVVar13,(Value<char> *)&local_b8.array_);
  }
  if (local_a8 != '\x02') {
    Value<char>::reset((Value<char> *)&local_b8.array_);
    local_a8 = '\x02';
  }
  pVVar13 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_b8.array_,"d",1)
  ;
  Value<char>::reset(pVVar13);
  (pVVar13->field_0).array_.storage_ = (Value<char> *)0x0;
  pVVar13->type_ = IntLong;
  if (local_a8 != '\x02') {
    Value<char>::reset((Value<char> *)&local_b8.array_);
    local_a8 = '\x02';
  }
  pVVar13 = HArray<Qentem::String<char>,_Qentem::Value<char>_>::Get
                      ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_b8.array_,"e",1)
  ;
  Value<char>::reset(pVVar13);
  (pVVar13->field_0).array_.storage_ = (Value<char> *)0x0;
  pVVar13->type_ = IntLong;
  pVVar13 = Value<char>::operator[]((Value<char> *)&local_88.array_,1);
  if (&pVVar13->field_0 != &local_b8) {
    Value<char>::reset(pVVar13);
    Value<char>::copyValue(pVVar13,(Value<char> *)&local_b8.array_);
  }
  Value<char>::Sort((Value<char> *)&local_88.array_,false);
  pSVar14 = Value<char>::Stringify<Qentem::StringStream<char>>
                      ((Value<char> *)&local_88.array_,&local_48,0xf);
  local_38 = test;
  QTest::IsEqual<Qentem::StringStream<char>,char[54]>
            (test,pSVar14,
             (char (*) [54])"[{\"a\":0,\"b\":0,\"c\":0,\"d\":0,\"e\":0},{\"a\":0,\"b\":0,\"c\":0}]",
             0x1762);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  Value<char>::reset((Value<char> *)&local_88.array_);
  local_78 = 0;
  Value<char>::reset((Value<char> *)&local_b8.array_);
  local_a8 = 0;
  Value<char>::reset((Value<char> *)&local_b8.array_);
  local_a8 = '\x03';
  local_68.array_.storage_ = (Value<char> *)0x0;
  local_68._8_8_ = 0;
  local_58 = 8;
  Array<Qentem::Value<char>_>::operator+=(&local_b8.array_,(Value<char> *)&local_68.array_);
  Value<char>::~Value((Value<char> *)&local_68.array_);
  if (local_a8 != '\x03') {
    Value<char>::reset((Value<char> *)&local_b8.array_);
    local_a8 = '\x03';
  }
  local_68.array_.storage_ = (Value<char> *)0x0;
  local_68._8_8_ = 0;
  local_58 = 8;
  Array<Qentem::Value<char>_>::operator+=(&local_b8.array_,(Value<char> *)&local_68.array_);
  Value<char>::~Value((Value<char> *)&local_68.array_);
  Value<char>::reset((Value<char> *)&local_88.array_);
  Value<char>::copyValue((Value<char> *)&local_88.array_,(Value<char> *)&local_b8.array_);
  Value<char>::Sort((Value<char> *)&local_88.array_,true);
  pSVar14 = Value<char>::Stringify<Qentem::StringStream<char>>
                      ((Value<char> *)&local_88.array_,&local_48,0xf);
  pQVar11 = local_38;
  QTest::IsEqual<Qentem::StringStream<char>,char[12]>
            (local_38,pSVar14,(char (*) [12])"[true,true]",0x1772);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  Value<char>::reset((Value<char> *)&local_88.array_);
  Value<char>::copyValue((Value<char> *)&local_88.array_,(Value<char> *)&local_b8.array_);
  Value<char>::Sort((Value<char> *)&local_88.array_,false);
  pSVar14 = Value<char>::Stringify<Qentem::StringStream<char>>
                      ((Value<char> *)&local_88.array_,&local_48,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[12]>
            (pQVar11,pSVar14,(char (*) [12])"[true,true]",0x1779);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  Value<char>::reset((Value<char> *)&local_88.array_);
  local_78 = 0;
  Value<char>::reset((Value<char> *)&local_b8.array_);
  local_a8 = 0;
  Value<char>::reset((Value<char> *)&local_b8.array_);
  local_a8 = '\x03';
  local_68.array_.storage_ = (Value<char> *)0x0;
  local_68._8_8_ = 0;
  local_58 = 9;
  Array<Qentem::Value<char>_>::operator+=(&local_b8.array_,(Value<char> *)&local_68.array_);
  Value<char>::~Value((Value<char> *)&local_68.array_);
  if (local_a8 != '\x03') {
    Value<char>::reset((Value<char> *)&local_b8.array_);
    local_a8 = '\x03';
  }
  local_68.array_.storage_ = (Value<char> *)0x0;
  local_68._8_8_ = 0;
  local_58 = 9;
  Array<Qentem::Value<char>_>::operator+=(&local_b8.array_,(Value<char> *)&local_68.array_);
  Value<char>::~Value((Value<char> *)&local_68.array_);
  Value<char>::reset((Value<char> *)&local_88.array_);
  Value<char>::copyValue((Value<char> *)&local_88.array_,(Value<char> *)&local_b8.array_);
  Value<char>::Sort((Value<char> *)&local_88.array_,true);
  pSVar14 = Value<char>::Stringify<Qentem::StringStream<char>>
                      ((Value<char> *)&local_88.array_,&local_48,0xf);
  pQVar11 = local_38;
  QTest::IsEqual<Qentem::StringStream<char>,char[14]>
            (local_38,pSVar14,(char (*) [14])"[false,false]",0x1787);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  Value<char>::reset((Value<char> *)&local_88.array_);
  Value<char>::copyValue((Value<char> *)&local_88.array_,(Value<char> *)&local_b8.array_);
  Value<char>::Sort((Value<char> *)&local_88.array_,false);
  pSVar14 = Value<char>::Stringify<Qentem::StringStream<char>>
                      ((Value<char> *)&local_88.array_,&local_48,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[14]>
            (pQVar11,pSVar14,(char (*) [14])"[false,false]",0x178e);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  Value<char>::reset((Value<char> *)&local_88.array_);
  local_78 = 0;
  Value<char>::reset((Value<char> *)&local_b8.array_);
  local_a8 = 0;
  Value<char>::reset((Value<char> *)&local_b8.array_);
  local_a8 = '\x03';
  local_68.array_.storage_ = (Value<char> *)0x0;
  local_68._8_8_ = 0;
  local_58 = 10;
  Array<Qentem::Value<char>_>::operator+=(&local_b8.array_,(Value<char> *)&local_68.array_);
  Value<char>::~Value((Value<char> *)&local_68.array_);
  if (local_a8 != '\x03') {
    Value<char>::reset((Value<char> *)&local_b8.array_);
    local_a8 = '\x03';
  }
  local_68.array_.storage_ = (Value<char> *)0x0;
  local_68._8_8_ = 0;
  local_58 = 10;
  Array<Qentem::Value<char>_>::operator+=(&local_b8.array_,(Value<char> *)&local_68.array_);
  Value<char>::~Value((Value<char> *)&local_68.array_);
  Value<char>::reset((Value<char> *)&local_88.array_);
  Value<char>::copyValue((Value<char> *)&local_88.array_,(Value<char> *)&local_b8.array_);
  Value<char>::Sort((Value<char> *)&local_88.array_,true);
  pSVar14 = Value<char>::Stringify<Qentem::StringStream<char>>
                      ((Value<char> *)&local_88.array_,&local_48,0xf);
  pQVar11 = local_38;
  QTest::IsEqual<Qentem::StringStream<char>,char[12]>
            (local_38,pSVar14,(char (*) [12])"[null,null]",0x179b);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  Value<char>::reset((Value<char> *)&local_88.array_);
  Value<char>::copyValue((Value<char> *)&local_88.array_,(Value<char> *)&local_b8.array_);
  Value<char>::Sort((Value<char> *)&local_88.array_,false);
  pSVar14 = Value<char>::Stringify<Qentem::StringStream<char>>
                      ((Value<char> *)&local_88.array_,&local_48,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[12]>
            (pQVar11,pSVar14,(char (*) [12])"[null,null]",0x17a2);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  Value<char>::RemoveIndex((Value<char> *)&local_88.array_,0);
  Value<char>::RemoveIndex((Value<char> *)&local_88.array_,1);
  Value<char>::Sort((Value<char> *)&local_88.array_,true);
  pSVar14 = Value<char>::Stringify<Qentem::StringStream<char>>
                      ((Value<char> *)&local_88.array_,&local_48,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[3]>(pQVar11,pSVar14,(char (*) [3])"[]",0x17aa);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  Value<char>::Sort((Value<char> *)&local_88.array_,false);
  pSVar14 = Value<char>::Stringify<Qentem::StringStream<char>>
                      ((Value<char> *)&local_88.array_,&local_48,0xf);
  QTest::IsEqual<Qentem::StringStream<char>,char[3]>(pQVar11,pSVar14,(char (*) [3])"[]",0x17af);
  Value<char>::~Value((Value<char> *)&local_b8.array_);
  Value<char>::~Value((Value<char> *)&local_88.array_);
  pcVar10 = local_48.storage_;
  if (local_48.storage_ != (char *)0x0) {
    MemoryRecord::RemoveAllocation(local_48.storage_);
  }
  operator_delete(pcVar10);
  return;
}

Assistant:

static void TestGroupValue(QTest &test) {
    StringStream<char> ss;
    ValueC             value;

    value += VHArray{};
    value += VHArray{};
    value += VHArray{};
    value += VHArray{};
    value += VHArray{};
    value += VHArray{};
    value += VHArray{};

    value[0]["year"] = 2019;
    value[1]["year"] = 2020;
    value[2]["year"] = 2017;
    value[3]["year"] = 2020;
    value[4]["year"] = 2018;
    value[5]["year"] = 2020;
    value[6]["year"] = 2018;

    value[0]["month"] = 4;
    value[1]["month"] = 5;
    value[2]["month"] = 1;
    value[3]["month"] = 6;
    value[4]["month"] = 2;
    value[5]["month"] = 7;
    value[6]["month"] = 3;

    ValueC value2;
    value.GroupBy(value2, "year");
    value2.Sort();

    test.IsEqual(
        value2.Stringify(ss),
        R"({"2017":[{"month":1}],"2018":[{"month":2},{"month":3}],"2019":[{"month":4}],"2020":[{"month":5},{"month":6},{"month":7}]})",
        __LINE__);
    ss.Clear();

    value2.Sort(false);

    test.IsEqual(
        value2.Stringify(ss),
        R"({"2020":[{"month":5},{"month":6},{"month":7}],"2019":[{"month":4}],"2018":[{"month":2},{"month":3}],"2017":[{"month":1}]})",
        __LINE__);
    ss.Clear();

    value.Reset();
    value2.Reset();
    value.GroupBy(value2, "year");
    test.IsEqual(value2.Stringify(ss), R"()", __LINE__);
    ss.Clear();

    value[0]["year1"] = 2019;
    value[1]["year1"] = 2020;
    value[2]["year1"] = 2017;
    value[3]["year1"] = 2020;
    value[4]["year1"] = 2018;
    value[5]["year1"] = 2020;
    value[6]["year1"] = 2018;

    value[0]["month"] = 4;
    value[1]["month"] = 5;
    value[2]["month"] = 1;
    value[3]["month"] = 6;
    value[4]["month"] = 2;
    value[5]["month"] = 7;
    value[6]["month"] = 3;

    value.GroupBy(value2, "year");
    test.IsEqual(value2.Stringify(ss), R"({})", __LINE__);
    ss.Clear();
    ////

    value.Reset();

    value[0]["year"] = 2019;
    value[1]["year"] = 2020;
    value[2]["year"];

    value[0]["month"] = 4;
    value[1]["month"] = 5;
    value[2]["month"] = 1;

    test.IsFalse(value.GroupBy(value2, "year"), __LINE__);

    value[2].Reset();
    value.GroupBy(value2, "year");
    test.IsFalse(value.GroupBy(value2, "year"), __LINE__);

    value[2]["year"] = VHArray{};
    test.IsFalse(value.GroupBy(value2, "year"), __LINE__);

    ///////////////////
    ss.Clear();

    value.Reset();
    value2.Reset();

    value2 += unsigned{4};
    value2 += unsigned{1};
    value2 += unsigned{3};
    value2 += unsigned{5};
    value2 += unsigned{2};
    value2 += unsigned{7};
    value2 += unsigned{6};

    value = value2;
    value.Sort();

    test.IsEqual(value.Stringify(ss), R"([1,2,3,4,5,6,7])", __LINE__);
    ss.Clear();

    value = value2;

    value.Sort(false);

    test.IsEqual(value.Stringify(ss), R"([7,6,5,4,3,2,1])", __LINE__);
    ss.Clear();

    //////////////////////

    value.Reset();
    value2.Reset();

    value2 += 5.4;
    value2 += "str";
    value2 += VArray{};
    value2 += nullptr;
    value2 += true;
    value2 += VHArray{};
    value2 += false;

    value = value2;
    value.Sort();

    test.IsEqual(value.Stringify(ss, 2U), R"([{},[],"str",5.4,true,false,null])", __LINE__);
    ss.Clear();

    value = value2;
    value.Sort(false);

    test.IsEqual(value.Stringify(ss, 2U), R"([null,false,true,5.4,"str",[],{}])", __LINE__);
    ss.Clear();

    ///////////////////

    value.Reset();
    value2.Reset();

    value2 += -4;
    value2 += -1;
    value2 += -3;
    value2 += -5;
    value2 += -2;
    value2 += -7;
    value2 += -6;

    value = value2;
    value.Sort();

    test.IsEqual(value.Stringify(ss), R"([-7,-6,-5,-4,-3,-2,-1])", __LINE__);
    ss.Clear();

    value = value2;

    value.Sort(false);

    test.IsEqual(value.Stringify(ss), R"([-1,-2,-3,-4,-5,-6,-7])", __LINE__);
    ss.Clear();

    ///////////////////

    value.Reset();
    value2.Reset();

    value2 += 4.5;
    value2 += 1.5;
    value2 += 3.5;
    value2 += 5.5;
    value2 += 2.5;
    value2 += 7.5;
    value2 += 6.5;

    value = value2;
    value.Sort();

    test.IsEqual(value.Stringify(ss), R"([1.5,2.5,3.5,4.5,5.5,6.5,7.5])", __LINE__);
    ss.Clear();

    value = value2;

    value.Sort(false);

    test.IsEqual(value.Stringify(ss), R"([7.5,6.5,5.5,4.5,3.5,2.5,1.5])", __LINE__);
    ss.Clear();

    ///////////////////
    value.Reset();
    value2.Reset();

    value2 += "b";
    value2 += "a";
    value2 += "g";
    value2 += "f";
    value2 += "c";
    value2 += "e";
    value2 += "d";

    value = value2;
    value.Sort();

    test.IsEqual(value.Stringify(ss), R"(["a","b","c","d","e","f","g"])", __LINE__);
    ss.Clear();

    value = value2;

    value.Sort(false);

    test.IsEqual(value.Stringify(ss), R"(["g","f","e","d","c","b","a"])", __LINE__);
    ss.Clear();

    ///////////////////

    value.Reset();
    value2.Reset();

    value2 += 0;
    value2 += 0;
    value2 += 0;
    value[0] = value2;

    value2 += 0;
    value2 += 0;
    value[1] = value2;

    value.Sort();

    test.IsEqual(value.Stringify(ss), R"([[0,0,0],[0,0,0,0,0]])", __LINE__);
    ss.Clear();

    value.Reset();
    value2.Reset();

    value2 += 0;
    value2 += 0;
    value2 += 0;
    value[0] = value2;

    value2 += 0;
    value2 += 0;
    value[1] = value2;

    value.Sort(false);

    test.IsEqual(value.Stringify(ss), R"([[0,0,0,0,0],[0,0,0]])", __LINE__);

    ///////////////////
    ss.Clear();

    value.Reset();
    value2.Reset();

    value2["a"] = 0;
    value2["b"] = 0;
    value2["c"] = 0;
    value[0]    = value2;

    value2["d"] = 0;
    value2["e"] = 0;
    value[1]    = value2;

    value.Sort();

    test.IsEqual(value.Stringify(ss), R"([{"a":0,"b":0,"c":0},{"a":0,"b":0,"c":0,"d":0,"e":0}])", __LINE__);
    ss.Clear();

    value.Reset();
    value2.Reset();

    value2["a"] = 0;
    value2["b"] = 0;
    value2["c"] = 0;
    value[0]    = value2;

    value2["d"] = 0;
    value2["e"] = 0;
    value[1]    = value2;

    value.Sort(false);

    test.IsEqual(value.Stringify(ss), R"([{"a":0,"b":0,"c":0,"d":0,"e":0},{"a":0,"b":0,"c":0}])", __LINE__);

    //////////////////////

    ///////////////////
    ss.Clear();

    value.Reset();
    value2.Reset();

    value2 += true;
    value2 += true;

    value = value2;
    value.Sort();

    test.IsEqual(value.Stringify(ss), R"([true,true])", __LINE__);
    ss.Clear();

    value = value2;

    value.Sort(false);

    test.IsEqual(value.Stringify(ss), R"([true,true])", __LINE__);
    ss.Clear();

    //////////

    value.Reset();
    value2.Reset();

    value2 += false;
    value2 += false;

    value = value2;
    value.Sort();

    test.IsEqual(value.Stringify(ss), R"([false,false])", __LINE__);
    ss.Clear();

    value = value2;

    value.Sort(false);

    test.IsEqual(value.Stringify(ss), R"([false,false])", __LINE__);
    ///////////
    ss.Clear();

    value.Reset();
    value2.Reset();

    value2 += nullptr;
    value2 += nullptr;

    value = value2;
    value.Sort();

    test.IsEqual(value.Stringify(ss), R"([null,null])", __LINE__);
    ss.Clear();

    value = value2;

    value.Sort(false);

    test.IsEqual(value.Stringify(ss), R"([null,null])", __LINE__);
    ss.Clear();
    ///////////
    value.RemoveIndex(0);
    value.RemoveIndex(1);

    value.Sort();

    test.IsEqual(value.Stringify(ss), R"([])", __LINE__);
    ss.Clear();

    value.Sort(false);

    test.IsEqual(value.Stringify(ss), R"([])", __LINE__);
    ///////////////////
}